

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O3

REF_STATUS ref_matrix_orthog(REF_INT n,REF_DBL *a)

{
  ulong uVar1;
  ulong uVar2;
  REF_DBL *pRVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  REF_DBL *pRVar7;
  REF_DBL *pRVar8;
  ulong uVar9;
  double dVar10;
  
  if (n < 1) {
    return 0;
  }
  uVar1 = (ulong)(uint)n;
  pRVar3 = a + uVar1;
  uVar4 = 1;
  uVar5 = 0;
  pRVar7 = a;
  do {
    uVar6 = uVar5 + 1;
    uVar2 = uVar4;
    pRVar8 = pRVar3;
    if (uVar6 < uVar1) {
      do {
        dVar10 = 0.0;
        uVar9 = 0;
        do {
          dVar10 = dVar10 + pRVar7[uVar9] * pRVar8[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar1 != uVar9);
        if (dVar10 <= -dVar10) {
          dVar10 = -dVar10;
        }
        if (1e-13 < dVar10) {
          printf(" %d-%d not orthog: %e\n",uVar5);
          printf(" %f %f %f\n",*a,a[3],a[6]);
          printf(" %f %f %f\n",a[1],a[4],a[7]);
          printf(" %f %f %f\n",a[2],a[5],a[8]);
          return 3;
        }
        uVar2 = uVar2 + 1;
        pRVar8 = pRVar8 + uVar1;
      } while (uVar2 != uVar1);
    }
    uVar4 = uVar4 + 1;
    pRVar3 = pRVar3 + uVar1;
    pRVar7 = pRVar7 + uVar1;
    uVar5 = uVar6;
    if (uVar6 == uVar1) {
      return 0;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_matrix_orthog(REF_INT n, REF_DBL *a) {
  REF_INT i, j, k;
  REF_DBL norm;

  for (i = 0; i < n; i++)
    for (j = i + 1; j < n; j++) {
      norm = 0.0;
      for (k = 0; k < n; k++) norm += a[k + n * i] * a[k + n * j];
      if (ABS(norm) > 1.0e-13) {
        printf(" %d-%d not orthog: %e\n", i, j, norm);
        printf(" %f %f %f\n", a[0], a[3], a[6]);
        printf(" %f %f %f\n", a[1], a[4], a[7]);
        printf(" %f %f %f\n", a[2], a[5], a[8]);
        return REF_INVALID;
      }
    }

  return REF_SUCCESS;
}